

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O2

void __thiscall
TEST_TestMemoryAccountant_reportWithCacheSizes_Test::
TEST_TestMemoryAccountant_reportWithCacheSizes_Test
          (TEST_TestMemoryAccountant_reportWithCacheSizes_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).testFunction.super_ExecFunction.
  _vptr_ExecFunction = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).testFunction.testFunction_ =
       (_func_void_MemoryAccountant_ptr *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).fixture.output_ =
       (StringBufferTestOutput *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).fixture.result_ = (TestResult *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).fixture.genTest_ =
       (ExecFunctionTestShell *)0x0;
  *(undefined8 *)
   &(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).fixture.ownsExecFunction_ = 0;
  (this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).fixture._vptr_TestTestingFixture =
       (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).fixture.registry_ = (TestRegistry *)0x0
  ;
  (this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant.allocator_ =
       (TestMemoryAllocator *)0x0;
  *(undefined8 *)
   &(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant.useCacheSizes_ = 0;
  (this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).super_Utest._vptr_Utest =
       (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant.head_ =
       (MemoryAccountantAllocationNode *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).testFunction.parameter_ =
       (MemoryAccountant *)0x0;
  TEST_GROUP_CppUTestGroupTestMemoryAccountant::TEST_GROUP_CppUTestGroupTestMemoryAccountant
            (&this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant);
  (this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupTestMemoryAccountant_00388bf0;
  return;
}

Assistant:

TEST(TestMemoryAccountant, reportWithCacheSizes)
{
    size_t cacheSizes[] = {4};

    accountant.useCacheSizes(cacheSizes, 1);
    accountant.dealloc(8);
    accountant.dealloc(12);
    accountant.dealloc(20);

    accountant.alloc(4);
    accountant.dealloc(4);
    accountant.alloc(4);
    STRCMP_EQUAL("CppUTest Memory Accountant report (with cache sizes):\n"
                 "Cache size          # allocations    # deallocations   max # allocations at one time\n"
                 "    4                   2                1                 1\n"
                 "other                   0                3                 0\n"
                 "   Thank you for your business\n"
                 , accountant.report().asCharString());
}